

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * __thiscall
QUtil::double_to_string_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,double num,int decimal_places,
          bool trim_trailing_zeroes)

{
  ulong uVar1;
  ostringstream buf;
  locale local_1a0 [8];
  long local_198;
  ulong local_190 [2];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  uVar1 = 6;
  if (0 < (int)this) {
    uVar1 = (ulong)this & 0xffffffff;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::locale::classic();
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  *(ulong *)((long)local_190 + *(long *)(local_198 + -0x18)) = uVar1;
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(num);
  std::__cxx11::stringbuf::str();
  if ((char)decimal_places != '\0') {
    while( true ) {
      uVar1 = __return_storage_ptr__->_M_string_length;
      if (uVar1 < 2) break;
      if ((__return_storage_ptr__->_M_dataplus)._M_p[uVar1 - 1] != '0') {
        if ((uVar1 >= 2) && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar1 - 1] == '.')) {
          std::__cxx11::string::pop_back();
        }
        break;
      }
      std::__cxx11::string::pop_back();
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::double_to_string(double num, int decimal_places, bool trim_trailing_zeroes)
{
    // Backward compatibility -- this code used to use sprintf and treated decimal_places <= 0 to
    // mean to use the default, which was six decimal places. Starting in 10.2, we trim trailing
    // zeroes by default.
    if (decimal_places <= 0) {
        decimal_places = 6;
    }
    std::ostringstream buf;
    buf.imbue(std::locale::classic());
    buf << std::setprecision(decimal_places) << std::fixed << num;
    std::string result = buf.str();
    if (trim_trailing_zeroes) {
        while ((result.length() > 1) && (result.back() == '0')) {
            result.pop_back();
        }
        if ((result.length() > 1) && (result.back() == '.')) {
            result.pop_back();
        }
    }
    return result;
}